

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_crt_verify_child
              (mbedtls_x509_crt *child,mbedtls_x509_crt *parent,mbedtls_x509_crt *trust_ca,
              mbedtls_x509_crl *ca_crl,mbedtls_x509_crt_profile *profile,int path_cnt,
              uint32_t *flags,_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,
              void *p_vrfy)

{
  mbedtls_md_type_t md_alg;
  mbedtls_pk_type_t type;
  void *options;
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  mbedtls_md_info_t *md_info;
  mbedtls_x509_crt *parent_00;
  undefined4 in_register_0000008c;
  mbedtls_x509_crt *parent_01;
  bool bVar5;
  uint32_t parent_flags;
  mbedtls_x509_crt_profile *local_98;
  mbedtls_x509_crl *local_90;
  mbedtls_x509_crt *local_88;
  undefined8 local_80;
  uchar hash [64];
  
  local_80 = CONCAT44(in_register_0000008c,path_cnt);
  parent_flags = 0;
  if (7 < path_cnt) {
    iVar2 = -0x2700;
    parent_flags = 8;
    goto LAB_00141eea;
  }
  local_90 = ca_crl;
  local_88 = trust_ca;
  iVar2 = mbedtls_x509_time_is_past(&child->valid_to);
  if (iVar2 != 0) {
    *(byte *)flags = (byte)*flags | 1;
  }
  iVar2 = mbedtls_x509_time_is_future(&child->valid_from);
  if (iVar2 != 0) {
    *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 2;
  }
  if ((profile->allowed_mds >> ((byte)((char)child->sig_md - MBEDTLS_MD_MD2) & 0x1f) & 1) == 0) {
    *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 0x40;
  }
  if ((profile->allowed_pks >> ((byte)((char)child->sig_pk - MBEDTLS_PK_RSA) & 0x1f) & 1) == 0) {
    *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 0x80;
  }
  md_info = mbedtls_md_info_from_type(child->sig_md);
  local_98 = profile;
  if (md_info == (mbedtls_md_info_t *)0x0) {
LAB_00142014:
    *(byte *)flags = (byte)*flags | 8;
  }
  else {
    mbedtls_md(md_info,(child->tbs).p,(child->tbs).len,hash);
    iVar2 = x509_profile_check_key(profile,child->sig_pk,&parent->pk);
    if (iVar2 != 0) {
      *(byte *)((long)flags + 2) = *(byte *)((long)flags + 2) | 1;
    }
    md_alg = child->sig_md;
    type = child->sig_pk;
    options = child->sig_opts;
    bVar1 = mbedtls_md_get_size(md_info);
    iVar2 = mbedtls_pk_verify_ext
                      (type,options,&parent->pk,md_alg,hash,(ulong)bVar1,(child->sig).p,
                       (child->sig).len);
    if (iVar2 != 0) goto LAB_00142014;
  }
  iVar2 = (int)local_80 + 1;
  uVar3 = x509_crt_verifycrl(child,parent,local_90,local_98);
  *flags = *flags | uVar3;
  if (local_88 != (mbedtls_x509_crt *)0x0) {
    bVar5 = (int)local_80 == 0;
    parent_00 = local_88;
    do {
      iVar4 = x509_crt_check_parent(parent,parent_00,0,(uint)bVar5);
      if (iVar4 == 0) goto LAB_00142103;
      parent_00 = parent_00->next;
    } while (parent_00 != (mbedtls_x509_crt *)0x0);
  }
  bVar5 = (int)local_80 == 0;
  parent_01 = parent;
  do {
    parent_01 = parent_01->next;
    parent_00 = local_88;
    if (parent_01 == (mbedtls_x509_crt *)0x0) goto LAB_00142103;
    iVar4 = x509_crt_check_parent(parent,parent_01,0,(uint)bVar5);
  } while (iVar4 != 0);
  iVar2 = x509_crt_verify_child
                    (parent,parent_01,local_88,local_90,local_98,iVar2,&parent_flags,f_vrfy,p_vrfy);
  goto LAB_0014212a;
LAB_00142103:
  iVar2 = x509_crt_verify_top(parent,parent_00,local_90,local_98,iVar2,&parent_flags,f_vrfy,p_vrfy);
LAB_0014212a:
  if (iVar2 != 0) {
    return iVar2;
  }
  if ((f_vrfy != (_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *)0x0) &&
     (iVar2 = (*f_vrfy)(p_vrfy,child,(int)local_80,flags), iVar2 != 0)) {
    return iVar2;
  }
  iVar2 = 0;
LAB_00141eea:
  *flags = *flags | parent_flags;
  return iVar2;
}

Assistant:

static int x509_crt_verify_child(
                mbedtls_x509_crt *child, mbedtls_x509_crt *parent,
                mbedtls_x509_crt *trust_ca, mbedtls_x509_crl *ca_crl,
                const mbedtls_x509_crt_profile *profile,
                int path_cnt, uint32_t *flags,
                int (*f_vrfy)(void *, mbedtls_x509_crt *, int, uint32_t *),
                void *p_vrfy )
{
    int ret;
    uint32_t parent_flags = 0;
    unsigned char hash[MBEDTLS_MD_MAX_SIZE];
    mbedtls_x509_crt *grandparent;
    const mbedtls_md_info_t *md_info;

    /* path_cnt is 0 for the first intermediate CA */
    if( 1 + path_cnt > MBEDTLS_X509_MAX_INTERMEDIATE_CA )
    {
        *flags |= MBEDTLS_X509_BADCERT_NOT_TRUSTED;
        return( MBEDTLS_ERR_X509_CERT_VERIFY_FAILED );
    }

    if( mbedtls_x509_time_is_past( &child->valid_to ) )
        *flags |= MBEDTLS_X509_BADCERT_EXPIRED;

    if( mbedtls_x509_time_is_future( &child->valid_from ) )
        *flags |= MBEDTLS_X509_BADCERT_FUTURE;

    if( x509_profile_check_md_alg( profile, child->sig_md ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_MD;

    if( x509_profile_check_pk_alg( profile, child->sig_pk ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_PK;

    md_info = mbedtls_md_info_from_type( child->sig_md );
    if( md_info == NULL )
    {
        /*
         * Cannot check 'unknown' hash
         */
        *flags |= MBEDTLS_X509_BADCERT_NOT_TRUSTED;
    }
    else
    {
        mbedtls_md( md_info, child->tbs.p, child->tbs.len, hash );

        if( x509_profile_check_key( profile, child->sig_pk, &parent->pk ) != 0 )
            *flags |= MBEDTLS_X509_BADCERT_BAD_KEY;

        if( mbedtls_pk_verify_ext( child->sig_pk, child->sig_opts, &parent->pk,
                           child->sig_md, hash, mbedtls_md_get_size( md_info ),
                           child->sig.p, child->sig.len ) != 0 )
        {
            *flags |= MBEDTLS_X509_BADCERT_NOT_TRUSTED;
        }
    }

#if defined(MBEDTLS_X509_CRL_PARSE_C)
    /* Check trusted CA's CRL for the given crt */
    *flags |= x509_crt_verifycrl(child, parent, ca_crl, profile );
#endif

    /* Look for a grandparent in trusted CAs */
    for( grandparent = trust_ca;
         grandparent != NULL;
         grandparent = grandparent->next )
    {
        if( x509_crt_check_parent( parent, grandparent,
                                   0, path_cnt == 0 ) == 0 )
            break;
    }

    if( grandparent != NULL )
    {
        ret = x509_crt_verify_top( parent, grandparent, ca_crl, profile,
                                path_cnt + 1, &parent_flags, f_vrfy, p_vrfy );
        if( ret != 0 )
            return( ret );
    }
    else
    {
        /* Look for a grandparent upwards the chain */
        for( grandparent = parent->next;
             grandparent != NULL;
             grandparent = grandparent->next )
        {
            if( x509_crt_check_parent( parent, grandparent,
                                       0, path_cnt == 0 ) == 0 )
                break;
        }

        /* Is our parent part of the chain or at the top? */
        if( grandparent != NULL )
        {
            ret = x509_crt_verify_child( parent, grandparent, trust_ca, ca_crl,
                                         profile, path_cnt + 1, &parent_flags,
                                         f_vrfy, p_vrfy );
            if( ret != 0 )
                return( ret );
        }
        else
        {
            ret = x509_crt_verify_top( parent, trust_ca, ca_crl, profile,
                                       path_cnt + 1, &parent_flags,
                                       f_vrfy, p_vrfy );
            if( ret != 0 )
                return( ret );
        }
    }

    /* child is verified to be a child of the parent, call verify callback */
    if( NULL != f_vrfy )
        if( ( ret = f_vrfy( p_vrfy, child, path_cnt, flags ) ) != 0 )
            return( ret );

    *flags |= parent_flags;

    return( 0 );
}